

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O2

ConstraintBlockSyntax * __thiscall
slang::parsing::Parser::parseConstraintBlock(Parser *this,bool isTopLevel)

{
  undefined8 uVar1;
  ConstraintBlockSyntax *pCVar2;
  bool bVar3;
  bool bVar4;
  Token openBrace;
  Token TVar5;
  Token closeBrace;
  ConstraintItemSyntax *member;
  SmallVector<slang::syntax::ConstraintItemSyntax_*,_8UL> members;
  undefined4 extraout_var;
  
  Token::Token(&closeBrace);
  openBrace = ParserBase::expect(&this->super_ParserBase,OpenBrace);
  members.super_SmallVectorBase<slang::syntax::ConstraintItemSyntax_*>.data_ =
       (pointer)members.super_SmallVectorBase<slang::syntax::ConstraintItemSyntax_*>.firstElement;
  members.super_SmallVectorBase<slang::syntax::ConstraintItemSyntax_*>.len = 0;
  members.super_SmallVectorBase<slang::syntax::ConstraintItemSyntax_*>.cap = 8;
  bVar3 = false;
  while( true ) {
    TVar5 = ParserBase::peek(&this->super_ParserBase);
    if ((TVar5.kind == EndOfFile) || (TVar5.kind == CloseBrace)) break;
    member = parseConstraintItem(this,false,isTopLevel);
    bVar4 = &member->super_SyntaxNode == (SyntaxNode *)0x0;
    if (bVar4) {
      ParserBase::skipToken
                (&this->super_ParserBase,
                 (optional<slang::DiagCode>)((uint6)((byte)~bVar3 & 1) << 0x20 | 0x350005));
      bVar3 = bVar4;
    }
    else {
      checkMemberAllowed(this,&member->super_SyntaxNode,ConstraintBlock);
      SmallVectorBase<slang::syntax::ConstraintItemSyntax*>::
      emplace_back<slang::syntax::ConstraintItemSyntax*const&>
                ((SmallVectorBase<slang::syntax::ConstraintItemSyntax*> *)&members,&member);
      bVar3 = bVar4;
    }
  }
  closeBrace = ParserBase::expect(&this->super_ParserBase,CloseBrace);
  uVar1._0_4_ = SmallVectorBase<slang::syntax::ConstraintItemSyntax_*>::copy
                          (&members.super_SmallVectorBase<slang::syntax::ConstraintItemSyntax_*>,
                           (EVP_PKEY_CTX *)(this->super_ParserBase).alloc,
                           (EVP_PKEY_CTX *)closeBrace.info);
  uVar1._4_4_ = extraout_var;
  SmallVectorBase<slang::syntax::ConstraintItemSyntax_*>::~SmallVectorBase
            (&members.super_SmallVectorBase<slang::syntax::ConstraintItemSyntax_*>);
  members.super_SmallVectorBase<slang::syntax::ConstraintItemSyntax_*>.len = 0;
  members.super_SmallVectorBase<slang::syntax::ConstraintItemSyntax_*>.cap =
       CONCAT44(members.super_SmallVectorBase<slang::syntax::ConstraintItemSyntax_*>.cap._4_4_,1);
  members.super_SmallVectorBase<slang::syntax::ConstraintItemSyntax_*>.data_ =
       (pointer)&PTR_getChild_004732c0;
  members.stackBase._0_8_ = uVar1;
  pCVar2 = slang::syntax::SyntaxFactory::constraintBlock
                     (&this->factory,openBrace,
                      (SyntaxList<slang::syntax::ConstraintItemSyntax> *)&members,closeBrace);
  return pCVar2;
}

Assistant:

ConstraintBlockSyntax& Parser::parseConstraintBlock(bool isTopLevel) {
    Token closeBrace;
    auto openBrace = expect(TokenKind::OpenBrace);
    auto members = parseMemberList<ConstraintItemSyntax>(
        TokenKind::CloseBrace, closeBrace, SyntaxKind::ConstraintBlock,
        [this, isTopLevel](SyntaxKind, bool&) { return parseConstraintItem(false, isTopLevel); });

    return factory.constraintBlock(openBrace, members, closeBrace);
}